

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_shutdown(uv_shutdown_t *req,uv_stream_t *stream,uv_shutdown_cb cb)

{
  uv_shutdown_cb cb_local;
  uv_stream_t *stream_local;
  uv_shutdown_t *req_local;
  
  if (((stream->type != UV_TCP) && (stream->type != UV_TTY)) && (stream->type != UV_NAMED_PIPE)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_TTY || stream->type == UV_NAMED_PIPE"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4c8,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
  }
  if ((((stream->flags & 0x8000) == 0) || ((stream->flags & 0x200) != 0)) ||
     (((stream->flags & 0x100) != 0 || ((stream->flags & 3) != 0)))) {
    req_local._4_4_ = -0x6b;
  }
  else {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x4d1,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
    }
    req->type = UV_SHUTDOWN;
    (stream->loop->active_reqs).count = (stream->loop->active_reqs).count + 1;
    req->handle = stream;
    req->cb = cb;
    stream->shutdown_req = req;
    stream->flags = stream->flags | 0x100;
    stream->flags = stream->flags & 0xffff7fff;
    if (stream->write_queue == (void **)stream->write_queue[0]) {
      uv__io_feed(stream->loop,&stream->io_watcher);
    }
    req_local._4_4_ = 0;
  }
  return req_local._4_4_;
}

Assistant:

int uv_shutdown(uv_shutdown_t* req, uv_stream_t* stream, uv_shutdown_cb cb) {
  assert(stream->type == UV_TCP ||
         stream->type == UV_TTY ||
         stream->type == UV_NAMED_PIPE);

  if (!(stream->flags & UV_HANDLE_WRITABLE) ||
      stream->flags & UV_HANDLE_SHUT ||
      stream->flags & UV_HANDLE_SHUTTING ||
      uv__is_closing(stream)) {
    return UV_ENOTCONN;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Initialize request. The `shutdown(2)` call will always be deferred until
   * `uv__drain`, just before the callback is run. */
  uv__req_init(stream->loop, req, UV_SHUTDOWN);
  req->handle = stream;
  req->cb = cb;
  stream->shutdown_req = req;
  stream->flags |= UV_HANDLE_SHUTTING;
  stream->flags &= ~UV_HANDLE_WRITABLE;

  if (QUEUE_EMPTY(&stream->write_queue))
    uv__io_feed(stream->loop, &stream->io_watcher);

  return 0;
}